

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__int____int
          (ColladaParserAutoGen14Private *this)

{
  byte bVar1;
  bool bVar2;
  StackMemoryManager *this_00;
  ParserChar **in_RDI;
  bool returnValue;
  sint64 parameter;
  ParserChar *ptrForErr;
  bool failed;
  ParserChar *in_stack_000000b8;
  ParserChar *in_stack_000000c0;
  StringHash in_stack_000000c8;
  ErrorType in_stack_000000d0;
  Severity in_stack_000000d4;
  ParserTemplateBase *in_stack_000000d8;
  ParserChar *in_stack_ffffffffffffffc8;
  bool local_21;
  byte local_9;
  
  this_00 = (StackMemoryManager *)
            GeneratedSaxParser::Utils::toSint64(in_RDI,in_stack_ffffffffffffffc8,(bool *)0x865b1a);
  if ((local_9 & 1) == 0) {
    bVar1 = (**(code **)(*(long *)in_RDI[0x21] + 0x670))(in_RDI[0x21],this_00);
  }
  else {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      (in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000c8,
                       in_stack_000000c0,in_stack_000000b8);
    bVar1 = bVar2 ^ 0xff;
  }
  local_21 = (bool)(bVar1 & 1);
  if (in_RDI[0x12] != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(this_00);
  }
  in_RDI[0x12] = (ParserChar *)0x0;
  in_RDI[0x13] = (ParserChar *)0x0;
  return local_21;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__int____int()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__int____int();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
sint64 parameter = GeneratedSaxParser::Utils::toSint64((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__int____int(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_INT, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}